

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datatypes.c
# Opt level: O0

Integer pnga_type_f2c(Integer type)

{
  Integer ctype;
  Integer type_local;
  
  switch(type) {
  case 0x3f2:
    ctype = 0x3ea;
    break;
  default:
    ctype = type;
    break;
  case 0x3f4:
    ctype = 0x3eb;
    break;
  case 0x3f5:
    ctype = 0x3ec;
    break;
  case 0x3f6:
    ctype = 0x3ee;
    break;
  case 0x3f7:
    ctype = 0x3ef;
  }
  return ctype;
}

Assistant:

Integer pnga_type_f2c(Integer type)
{
Integer ctype;
   switch(type){
   case MT_F_INT: 
#       if   SIZEOF_F77_INTEGER == SIZEOF_INT
                ctype = C_INT;
#       elif SIZEOF_F77_INTEGER == SIZEOF_LONG
                ctype = C_LONG;
#       elif SIZEOF_F77_INTEGER == SIZEOF_LONG_LONG
                ctype = C_LONGLONG;
#       else
#           error SIZEOF_F77_INTEGER == SIZEOF_???
#       endif
                break;
   case MT_F_REAL: 
#       if   SIZEOF_F77_REAL == SIZEOF_FLOAT
                ctype = C_FLOAT;
#       elif SIZEOF_F77_REAL == SIZEOF_DOUBLE
                ctype = C_DBL;
#       elif SIZEOF_F77_REAL == SIZEOF_LONG_DOUBLE
#           error SIZEOF_F77_REAL == SIZEOF_LONG_DOUBLE not supported?
#       else
#           error SIZEOF_F77_REAL == SIZEOF_???
#       endif
                break;
   case MT_F_DBL: 
#       if   SIZEOF_F77_DOUBLE_PRECISION == SIZEOF_DOUBLE
                ctype = C_DBL;
#       elif SIZEOF_F77_DOUBLE_PRECISION == SIZEOF_LONG_DOUBLE
#           error SIZEOF_F77_DOUBLE_PRECISION == SIZEOF_LONG_DOUBLE not supported?
#       else
#           error SIZEOF_F77_DOUBLE_PRECISION == SIZEOF_???
#       endif
                break;
   case MT_F_DCPL: 
		ctype = C_DCPL;
                break;
   case MT_F_SCPL: 
#       if   SIZEOF_F77_REAL == SIZEOF_FLOAT
                ctype = C_SCPL;
#       elif SIZEOF_F77_REAL == SIZEOF_DOUBLE
                ctype = C_DCPL;
#       elif SIZEOF_F77_REAL == SIZEOF_LONG_DOUBLE
#           error SIZEOF_F77_REAL == SIZEOF_LONG_DOUBLE not supported?
#       else
#           error SIZEOF_F77_REAL == SIZEOF_???
#       endif
                break;
   default:     ctype = type;
                break;
   }
   
   return(ctype);
}